

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcstest.c
# Opt level: O0

int main(void)

{
  int iVar1;
  error_mgr jerr;
  jpeg_compress_struct cinfo;
  int jcs_alpha_valid;
  int jcs_valid;
  code *local_388 [2];
  code *local_378;
  __jmp_buf_tag _Stack_2e0;
  undefined8 local_218 [7];
  undefined4 local_1e0;
  undefined4 local_1dc;
  uint local_c;
  uint local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_8 = 0xffffffff;
  local_c = 0xffffffff;
  printf("libjpeg-turbo colorspace extensions:\n");
  printf("  Present at compile time\n");
  local_218[0] = jpeg_std_error(local_388);
  local_388[0] = my_error_exit;
  local_378 = my_output_message;
  iVar1 = _setjmp(&_Stack_2e0);
  if (iVar1 == 0) {
    jpeg_CreateCompress(local_218,0x3e,0x208);
    local_1e0 = 3;
    jpeg_set_defaults(local_218);
    local_1dc = 6;
    jpeg_default_colorspace(local_218);
  }
  local_8 = (uint)(iVar1 == 0);
  if (local_8 == 0) {
    printf("  Not working properly.  Error returned was:\n    %s\n",lasterror);
  }
  else {
    printf("  Working properly\n");
  }
  printf("libjpeg-turbo alpha colorspace extensions:\n");
  printf("  Present at compile time\n");
  iVar1 = _setjmp(&_Stack_2e0);
  if (iVar1 == 0) {
    local_1dc = 0xc;
    jpeg_default_colorspace(local_218);
  }
  local_c = (uint)(iVar1 == 0);
  if (local_c == 0) {
    printf("  Not working properly.  Error returned was:\n    %s\n",lasterror);
  }
  else {
    printf("  Working properly\n");
  }
  jpeg_destroy_compress(local_218);
  return 0;
}

Assistant:

int main(void)
{
  int jcs_valid = -1, jcs_alpha_valid = -1;
  struct jpeg_compress_struct cinfo;
  error_mgr jerr;

  printf("libjpeg-turbo colorspace extensions:\n");
#if JCS_EXTENSIONS
  printf("  Present at compile time\n");
#else
  printf("  Not present at compile time\n");
#endif

  cinfo.err = jpeg_std_error(&jerr.pub);
  jerr.pub.error_exit = my_error_exit;
  jerr.pub.output_message = my_output_message;

  if (setjmp(jerr.jb)) {
    /* this will execute if libjpeg has an error */
    jcs_valid = 0;
    goto done;
  }

  jpeg_create_compress(&cinfo);
  cinfo.input_components = 3;
  jpeg_set_defaults(&cinfo);
  cinfo.in_color_space = JCS_EXT_RGB;
  jpeg_default_colorspace(&cinfo);
  jcs_valid = 1;

done:
  if (jcs_valid)
    printf("  Working properly\n");
  else
    printf("  Not working properly.  Error returned was:\n    %s\n",
           lasterror);

  printf("libjpeg-turbo alpha colorspace extensions:\n");
#if JCS_ALPHA_EXTENSIONS
  printf("  Present at compile time\n");
#else
  printf("  Not present at compile time\n");
#endif

  if (setjmp(jerr.jb)) {
    /* this will execute if libjpeg has an error */
    jcs_alpha_valid = 0;
    goto done2;
  }

  cinfo.in_color_space = JCS_EXT_RGBA;
  jpeg_default_colorspace(&cinfo);
  jcs_alpha_valid = 1;

done2:
  if (jcs_alpha_valid)
    printf("  Working properly\n");
  else
    printf("  Not working properly.  Error returned was:\n    %s\n",
           lasterror);

  jpeg_destroy_compress(&cinfo);
  return 0;
}